

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalNinjaGenerator::AddCustomCommandRule(cmGlobalNinjaGenerator *this)

{
  cmNinjaRule rule;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  cmNinjaRule local_140;
  
  local_160 = &local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"CUSTOM_COMMAND","");
  local_140.Name._M_dataplus._M_p = (pointer)&local_140.Name.field_2;
  if (local_160 == &local_150) {
    local_140.Name.field_2._8_8_ = local_150._8_8_;
  }
  else {
    local_140.Name._M_dataplus._M_p = (pointer)local_160;
  }
  local_140.Name._M_string_length = local_158;
  local_158 = 0;
  local_150._M_local_buf[0] = '\0';
  local_140.Command._M_dataplus._M_p = (pointer)&local_140.Command.field_2;
  local_140.Command._M_string_length = 0;
  local_140.Command.field_2._M_local_buf[0] = '\0';
  local_140.Description._M_dataplus._M_p = (pointer)&local_140.Description.field_2;
  local_140.Description._M_string_length = 0;
  local_140.Description.field_2._M_local_buf[0] = '\0';
  local_140.Comment._M_dataplus._M_p = (pointer)&local_140.Comment.field_2;
  local_140.Comment._M_string_length = 0;
  local_140.Comment.field_2._M_local_buf[0] = '\0';
  local_140.DepFile._M_dataplus._M_p = (pointer)&local_140.DepFile.field_2;
  local_140.DepFile._M_string_length = 0;
  local_140.DepFile.field_2._M_local_buf[0] = '\0';
  local_140.DepType._M_dataplus._M_p = (pointer)&local_140.DepType.field_2;
  local_140.DepType._M_string_length = 0;
  local_140.DepType.field_2._M_local_buf[0] = '\0';
  local_140.RspFile._M_dataplus._M_p = (pointer)&local_140.RspFile.field_2;
  local_140.RspFile._M_string_length = 0;
  local_140.RspFile.field_2._M_local_buf[0] = '\0';
  local_140.RspContent._M_dataplus._M_p = (pointer)&local_140.RspContent.field_2;
  local_140.RspContent._M_string_length = 0;
  local_140.RspContent.field_2._M_local_buf[0] = '\0';
  local_140.Restat._M_dataplus._M_p = (pointer)&local_140.Restat.field_2;
  local_140.Restat._M_string_length = 0;
  local_140.Restat.field_2._M_local_buf[0] = '\0';
  local_140.Generator = false;
  local_160 = &local_150;
  std::__cxx11::string::_M_replace((ulong)&local_140.Command,0,(char *)0x0,0x5c23fb);
  std::__cxx11::string::_M_replace
            ((ulong)&local_140.Description,0,(char *)local_140.Description._M_string_length,0x5c2404
            );
  std::__cxx11::string::_M_replace
            ((ulong)&local_140.Comment,0,(char *)local_140.Comment._M_string_length,0x5c240a);
  AddRule(this,&local_140);
  cmNinjaRule::~cmNinjaRule(&local_140);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddCustomCommandRule()
{
  cmNinjaRule rule("CUSTOM_COMMAND");
  rule.Command = "$COMMAND";
  rule.Description = "$DESC";
  rule.Comment = "Rule for running custom commands.";
  this->AddRule(rule);
}